

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandBuffer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  char *pcVar6;
  SC_BusPars *pPars;
  char *pcVar7;
  float fVar8;
  SC_BusPars Pars;
  SC_BusPars local_68;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  local_68.nDegree = 0;
  local_68.fSizeOnly = 0;
  local_68.fAddBufs = 0;
  local_68.fBufPis = 0;
  local_68.fUseWireLoads = 0;
  local_68.fVerbose = 0;
  local_68.fVeryVerbose = 0;
  local_68.GainRatio = 300;
  local_68.Slew = 0;
  local_40 = pAbc;
  if ((SC_Lib *)pAbc->pLibScl == (SC_Lib *)0x0) {
    iVar2 = 100;
  }
  else {
    fVar8 = Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl);
    iVar2 = (int)fVar8;
  }
  local_68.Slew = iVar2;
  local_68.nDegree = 10;
  local_68.fSizeOnly = 0;
  local_68.fAddBufs = 1;
  local_68.fBufPis = 0;
  local_68.fUseWireLoads = 0;
  local_68.fVerbose = 0;
  local_68.fVeryVerbose = 0;
  Extra_UtilGetoptReset();
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"GSNsbpcvwh"), pAVar4 = local_38, pAVar1 = local_40,
          iVar2 = globalUtilOptind, 0x61 < iVar3) {
      if (iVar3 - 0x70U < 8) {
        piVar5 = &local_68.fSizeOnly;
        switch(iVar3) {
        case 0x70:
          piVar5 = &local_68.fBufPis;
          break;
        default:
          goto switchD_0044f686_caseD_71;
        case 0x73:
          break;
        case 0x76:
          piVar5 = &local_68.fVerbose;
          break;
        case 0x77:
          piVar5 = &local_68.fVeryVerbose;
        }
      }
      else {
        piVar5 = &local_68.fAddBufs;
        if ((iVar3 != 0x62) && (piVar5 = &local_68.fUseWireLoads, iVar3 != 99))
        goto switchD_0044f686_caseD_71;
      }
      *(byte *)piVar5 = (byte)*piVar5 ^ 1;
    }
    if (iVar3 < 0x4e) {
      if (iVar3 != 0x47) {
        if (iVar3 == -1) {
          if (local_38 == (Abc_Ntk_t *)0x0) {
            pcVar6 = "Empty network.\n";
          }
          else if (local_38->ntkType == ABC_NTK_LOGIC) {
            if ((local_68.fAddBufs == 0 && local_68.fSizeOnly == 0) &&
               (local_38->vPhases == (Vec_Int_t *)0x0)) {
              pcVar6 = "Fanin phase information is not avaiable.\n";
            }
            else if ((local_40->pLibScl == (void *)0x0) ||
                    (iVar2 = Abc_SclHasDelayInfo(local_40->pLibScl), iVar2 == 0)) {
              pcVar6 = "Library delay info is not available.\n";
            }
            else {
              pAVar4 = Abc_SclBufferingPerform(pAVar4,(SC_Lib *)pAVar1->pLibScl,&local_68);
              if (pAVar4 != (Abc_Ntk_t *)0x0) {
                Abc_FrameReplaceCurrentNetwork(pAVar1,pAVar4);
                return 0;
              }
              pcVar6 = "The command has failed.\n";
            }
          }
          else {
            pcVar6 = "This command can only be applied to a logic network.\n";
          }
          Abc_Print(-1,pcVar6);
          return 1;
        }
        goto switchD_0044f686_caseD_71;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-G\" should be followed by a positive integer.\n";
        goto LAB_0044f7de;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      local_68.GainRatio = iVar3;
    }
    else if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by a positive integer.\n";
        goto LAB_0044f7de;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      local_68.nDegree = iVar3;
    }
    else {
      if (iVar3 != 0x53) goto switchD_0044f686_caseD_71;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by a positive integer.\n";
LAB_0044f7de:
        Abc_Print(-1,pcVar6);
        goto switchD_0044f686_caseD_71;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      local_68.Slew = iVar3;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar3 < 0) {
switchD_0044f686_caseD_71:
      pAVar1 = local_40;
      fwrite("usage: buffer [-GSN num] [-sbpcvwh]\n",0x24,1,(FILE *)local_40->Err);
      fwrite("\t           performs buffering and sizing and mapped network\n",0x3d,1,
             (FILE *)pAVar1->Err);
      fprintf((FILE *)pAVar1->Err,"\t-G <num> : target gain percentage [default = %d]\n",
              local_68._0_8_ & 0xffffffff);
      fprintf((FILE *)pAVar1->Err,"\t-S <num> : target slew in pisoseconds [default = %d]\n",
              (ulong)local_68._0_8_ >> 0x20);
      fprintf((FILE *)pAVar1->Err,"\t-N <num> : the maximum fanout count [default = %d]\n",
              local_68._8_8_ & 0xffffffff);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_68.fSizeOnly == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,"\t-s       : toggle performing only sizing [default = %s]\n",
              pcVar6);
      pcVar6 = "yes";
      if (local_68.fAddBufs == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-b       : toggle using buffers instead of inverters [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_68.fBufPis == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,"\t-p       : toggle buffering primary inputs [default = %s]\n",
              pcVar6);
      pcVar6 = "yes";
      if (local_68.fUseWireLoads == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-c       : toggle using wire-loads if specified [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_68.fVerbose == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-v       : toggle printing verbose information [default = %s]\n",pcVar6);
      if (local_68.fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAVar1->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar7);
      fwrite("\t-h       : print the command usage\n",0x24,1,(FILE *)pAVar1->Err);
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandBuffer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    SC_BusPars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_BusPars) );
    pPars->GainRatio     =  300;
    pPars->Slew          = pAbc->pLibScl ? Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl) : 100;
    pPars->nDegree       =   10;
    pPars->fSizeOnly     =    0;
    pPars->fAddBufs      =    1;
    pPars->fBufPis       =    0;
    pPars->fUseWireLoads =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "GSNsbpcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->GainRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->GainRatio < 0 ) 
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Slew = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Slew < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDegree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDegree < 0 ) 
                goto usage;
            break;
        case 's':
            pPars->fSizeOnly ^= 1;
            break;
        case 'b':
            pPars->fAddBufs ^= 1;
            break;
        case 'p':
            pPars->fBufPis ^= 1;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( !pPars->fSizeOnly && !pPars->fAddBufs && pNtk->vPhases == NULL )
    {
        Abc_Print( -1, "Fanin phase information is not avaiable.\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_SclBufferingPerform( pNtk, (SC_Lib *)pAbc->pLibScl, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: buffer [-GSN num] [-sbpcvwh]\n" );
    fprintf( pAbc->Err, "\t           performs buffering and sizing and mapped network\n" );
    fprintf( pAbc->Err, "\t-G <num> : target gain percentage [default = %d]\n", pPars->GainRatio );
    fprintf( pAbc->Err, "\t-S <num> : target slew in pisoseconds [default = %d]\n", pPars->Slew );
    fprintf( pAbc->Err, "\t-N <num> : the maximum fanout count [default = %d]\n", pPars->nDegree );
    fprintf( pAbc->Err, "\t-s       : toggle performing only sizing [default = %s]\n", pPars->fSizeOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-b       : toggle using buffers instead of inverters [default = %s]\n", pPars->fAddBufs? "yes": "no" );
    fprintf( pAbc->Err, "\t-p       : toggle buffering primary inputs [default = %s]\n", pPars->fBufPis? "yes": "no" );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}